

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_0::CheckDecorationsOfEntryPoints(ValidationState_t *vstate)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  Decoration DVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference puVar7;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *this_00;
  reference pEVar8;
  AssemblyGrammar *pAVar9;
  spv_const_context psVar10;
  reference pDVar11;
  size_type sVar12;
  Instruction *pIVar13;
  DiagnosticStream *pDVar14;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *psVar15;
  utils *this_01;
  undefined1 assert_found_terminating_null;
  pair<std::__detail::_Node_iterator<spvtools::val::Instruction_*,_true,_false>,_bool> pVar16;
  pair<std::__detail::_Node_iterator<spv::BuiltIn,_true,_false>,_bool> pVar17;
  bool local_24b9;
  uint32_t local_2494;
  uint32_t local_2474;
  DiagnosticStream local_2460;
  DiagnosticStream local_2288;
  DiagnosticStream local_20b0;
  byte local_1ed1;
  undefined1 local_1ed0 [7];
  bool workgroup_blocks_allowed;
  undefined1 local_1cf8 [8];
  string linkage_name;
  Decoration *decoration_1;
  iterator __end4_1;
  iterator __begin4_1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range4_1;
  string local_1ae0;
  DiagnosticStream local_1ac0;
  undefined1 local_18e1;
  undefined1 local_18e0 [7];
  bool has_flat;
  string local_18c0;
  DiagnosticStream local_18a0;
  string local_16c8;
  string local_16a8;
  DiagnosticStream local_1688;
  byte local_14aa;
  byte local_14a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_14a8;
  Decoration local_1490;
  byte local_1462;
  byte local_1461;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1460;
  Decoration local_1448;
  byte local_141a;
  byte local_1419;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1418;
  Decoration local_1400;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_13d8;
  Decoration local_13c0;
  reference local_1398;
  Decoration *decoration;
  iterator __end6;
  iterator __begin6;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range6;
  key_type local_136c;
  _Self local_1368;
  byte local_1359;
  iterator iStack_1358;
  bool has_vert;
  key_type local_134c;
  _Self local_1348;
  byte local_1339;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psStack_1338;
  bool has_frag;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *models;
  DiagnosticStream local_1158;
  string local_f80;
  DiagnosticStream local_f60;
  spv_result_t local_d84;
  char *pcStack_d80;
  spv_result_t error;
  string local_d78;
  DiagnosticStream local_d58;
  _Node_iterator_base<spv::BuiltIn,_false> local_b80;
  byte local_b78;
  _Node_iterator_base<spv::BuiltIn,_false> local_b70;
  byte local_b68;
  char *local_b60;
  string local_b58;
  DiagnosticStream local_b38;
  _Node_iterator_base<spv::BuiltIn,_false> local_960;
  byte local_958;
  _Node_iterator_base<spv::BuiltIn,_false> local_950;
  byte local_948;
  BuiltIn local_93c;
  reference pDStack_938;
  BuiltIn builtin;
  Decoration *dec;
  iterator __end5;
  iterator __begin5;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range5;
  bool has_built_in;
  bool is_struct;
  Instruction *type_instr;
  uint32_t type_id;
  string local_728;
  DiagnosticStream local_708;
  _Node_iterator_base<spvtools::val::Instruction_*,_false> local_530;
  byte local_528;
  _Node_iterator_base<spvtools::val::Instruction_*,_false> local_520;
  byte local_518;
  DiagnosticStream local_510;
  StorageClass local_338;
  undefined4 local_334;
  StorageClass storage_class;
  uint sc_index;
  bool untyped_pointers;
  char *pcStack_328;
  DiagnosticStream local_320;
  Instruction *local_148;
  Instruction *var_instr;
  const_iterator cStack_138;
  uint interface;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  output_var_builtin;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  input_var_builtin;
  unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
  seen_vars;
  EntryPointDescription *desc;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *__range3;
  int local_50;
  int num_workgroup_variables_with_aliased;
  int num_workgroup_variables_with_block;
  int num_workgroup_variables;
  int num_builtin_block_outputs;
  int num_builtin_block_inputs;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *descs;
  const_iterator cStack_30;
  uint32_t entry_point;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  ValidationState_t *vstate_local;
  
  this = ValidationState_t::entry_points(vstate);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
  cStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    descs._4_4_ = *puVar7;
    this_00 = ValidationState_t::entry_point_descriptions(vstate,descs._4_4_);
    num_workgroup_variables = 0;
    num_workgroup_variables_with_block = 0;
    num_workgroup_variables_with_aliased = 0;
    local_50 = 0;
    __range3._4_4_ = 0;
    __end3 = std::
             vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
             ::begin(this_00);
    desc = (EntryPointDescription *)
           std::
           vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
           ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
                                       *)&desc), bVar2) {
      pEVar8 = __gnu_cxx::
               __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
               ::operator*(&__end3);
      std::
      unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
      ::unordered_set((unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
                       *)&input_var_builtin._M_h._M_single_bucket);
      std::
      unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
      ::unordered_set((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                       *)&output_var_builtin._M_h._M_single_bucket);
      std::
      unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
      ::unordered_set((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                       *)&__range4);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pEVar8->interfaces);
      cStack_138 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             (&pEVar8->interfaces);
      while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffec8), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        var_instr._4_4_ = *puVar7;
        local_148 = ValidationState_t::FindDef(vstate,var_instr._4_4_);
        if ((local_148 == (Instruction *)0x0) ||
           ((OVar4 = Instruction::opcode(local_148), OVar4 != OpVariable &&
            (OVar4 = Instruction::opcode(local_148), OVar4 != OpUntypedVariableKHR)))) {
          ValidationState_t::diag(&local_320,vstate,SPV_ERROR_INVALID_ID,local_148);
          pDVar14 = DiagnosticStream::operator<<
                              (&local_320,
                               (char (*) [62])
                               "Interfaces passed to OpEntryPoint must be variables. Found Op");
          OVar4 = Instruction::opcode(local_148);
          pcStack_328 = spvOpcodeString(OVar4);
          pDVar14 = DiagnosticStream::operator<<(pDVar14,&stack0xfffffffffffffcd8);
          pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [2])0x3cdc5b);
          vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
          DiagnosticStream::~DiagnosticStream(&local_320);
          sc_index = 1;
          goto LAB_002cccc3;
        }
        OVar4 = Instruction::opcode(local_148);
        storage_class._3_1_ = OVar4 == OpUntypedVariableKHR;
        local_334 = 2;
        local_338 = Instruction::GetOperandAs<spv::StorageClass>(local_148,2);
        uVar5 = ValidationState_t::version(vstate);
        if (uVar5 < 0x10400) {
          if ((local_338 != Input) && (local_338 != Output)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&type_id,vstate,SPV_ERROR_INVALID_ID,local_148);
            pDVar14 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&type_id,
                                 (char (*) [110])
                                 "OpEntryPoint interfaces must be OpVariables with Storage Class of Input(1) or Output(3). Found Storage Class "
                                );
            type_instr._4_4_ = local_338;
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&type_instr + 4));
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [21])0x3d7ffc);
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [2])0x3cdc5b);
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_id);
            sc_index = 1;
            goto LAB_002cccc3;
          }
        }
        else {
          if (local_338 == Function) {
            ValidationState_t::diag(&local_510,vstate,SPV_ERROR_INVALID_ID,local_148);
            pDVar14 = DiagnosticStream::operator<<
                                (&local_510,
                                 (char (*) [58])
                                 "OpEntryPoint interfaces should only list global variables");
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            DiagnosticStream::~DiagnosticStream(&local_510);
            sc_index = 1;
            goto LAB_002cccc3;
          }
          pVar16 = std::
                   unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
                   ::insert((unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
                             *)&input_var_builtin._M_h._M_single_bucket,&local_148);
          local_530._M_cur =
               (__node_type *)
               pVar16.first.super__Node_iterator_base<spvtools::val::Instruction_*,_false>._M_cur;
          local_528 = pVar16.second;
          local_520._M_cur = local_530._M_cur;
          local_518 = local_528;
          if (((local_528 ^ 0xff) & 1) != 0) {
            ValidationState_t::diag(&local_708,vstate,SPV_ERROR_INVALID_ID,local_148);
            pDVar14 = DiagnosticStream::operator<<
                                (&local_708,(char (*) [35])"Non-unique OpEntryPoint interface ");
            ValidationState_t::getIdName_abi_cxx11_(&local_728,vstate,var_instr._4_4_);
            pDVar14 = DiagnosticStream::operator<<(pDVar14,&local_728);
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [15])" is disallowed");
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            std::__cxx11::string::~string((string *)&local_728);
            DiagnosticStream::~DiagnosticStream(&local_708);
            sc_index = 1;
            goto LAB_002cccc3;
          }
        }
        if ((storage_class._3_1_ & 1) == UniformConstant >> 0x18) {
          uVar5 = Instruction::word(local_148,1);
          pIVar13 = ValidationState_t::FindDef(vstate,uVar5);
          local_2474 = Instruction::word(pIVar13,3);
        }
        else {
          local_2474 = Instruction::word(local_148,4);
        }
        type_instr._0_4_ = local_2474;
        pIVar13 = ValidationState_t::FindDef(vstate,local_2474);
        bVar2 = false;
        if (pIVar13 != (Instruction *)0x0) {
          OVar4 = Instruction::opcode(pIVar13);
          bVar2 = OVar4 == OpTypeStruct;
        }
        bVar1 = false;
        if (bVar2) {
          local_2494 = (uint32_t)type_instr;
        }
        else {
          local_2494 = var_instr._4_4_;
        }
        psVar15 = ValidationState_t::id_decorations(vstate,local_2494);
        __end5 = std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::begin(psVar15);
        dec = (Decoration *)
              std::
              set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
              ::end(psVar15);
        while (bVar3 = std::operator!=(&__end5,(_Self *)&dec), bVar3) {
          pDStack_938 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end5);
          DVar6 = Decoration::dec_type(pDStack_938);
          if (DVar6 == BuiltIn) {
            bVar1 = true;
            psVar10 = ValidationState_t::context(vstate);
            bVar3 = spvIsVulkanEnv(psVar10->target_env);
            if (bVar3) {
              local_93c = Decoration::builtin(pDStack_938);
              if (local_338 == Input) {
                pVar17 = std::
                         unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                         ::insert((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                                   *)&output_var_builtin._M_h._M_single_bucket,&local_93c);
                local_960._M_cur =
                     (__node_type *)
                     pVar17.first.super__Node_iterator_base<spv::BuiltIn,_false>._M_cur;
                local_958 = pVar17.second;
                local_950._M_cur = local_960._M_cur;
                local_948 = local_958;
                if (((local_958 ^ 0xff) & 1) != 0) {
                  ValidationState_t::diag(&local_b38,vstate,SPV_ERROR_INVALID_ID,local_148);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_b58,vstate,0x25ba,(char *)0x0);
                  pDVar14 = DiagnosticStream::operator<<(&local_b38,&local_b58);
                  pDVar14 = DiagnosticStream::operator<<
                                      (pDVar14,(char (*) [54])
                                               "OpEntryPoint contains duplicate input variables with "
                                      );
                  pAVar9 = ValidationState_t::grammar(vstate);
                  local_b60 = AssemblyGrammar::lookupOperandName
                                        (pAVar9,SPV_OPERAND_TYPE_BUILT_IN,local_93c);
                  pDVar14 = DiagnosticStream::operator<<(pDVar14,&local_b60);
                  pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [9])" builtin");
                  vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
                  std::__cxx11::string::~string((string *)&local_b58);
                  DiagnosticStream::~DiagnosticStream(&local_b38);
                  sc_index = 1;
                  goto LAB_002cccc3;
                }
              }
              if (local_338 == Output) {
                pVar17 = std::
                         unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                         ::insert((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                                   *)&__range4,&local_93c);
                local_b80._M_cur =
                     (__node_type *)
                     pVar17.first.super__Node_iterator_base<spv::BuiltIn,_false>._M_cur;
                local_b78 = pVar17.second;
                local_b70._M_cur = local_b80._M_cur;
                local_b68 = local_b78;
                if (((local_b78 ^ 0xff) & 1) != 0) {
                  ValidationState_t::diag(&local_d58,vstate,SPV_ERROR_INVALID_ID,local_148);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_d78,vstate,0x25bb,(char *)0x0);
                  pDVar14 = DiagnosticStream::operator<<(&local_d58,&local_d78);
                  pDVar14 = DiagnosticStream::operator<<
                                      (pDVar14,(char (*) [55])
                                               "OpEntryPoint contains duplicate output variables with "
                                      );
                  pAVar9 = ValidationState_t::grammar(vstate);
                  pcStack_d80 = AssemblyGrammar::lookupOperandName
                                          (pAVar9,SPV_OPERAND_TYPE_BUILT_IN,local_93c);
                  pDVar14 = DiagnosticStream::operator<<(pDVar14,&stack0xfffffffffffff280);
                  pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [9])" builtin");
                  vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
                  std::__cxx11::string::~string((string *)&local_d78);
                  DiagnosticStream::~DiagnosticStream(&local_d58);
                  sc_index = 1;
                  goto LAB_002cccc3;
                }
              }
            }
          }
          std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end5);
        }
        if (bVar1) {
          local_d84 = CheckBuiltInVariable(var_instr._4_4_,vstate);
          if (local_d84 != SPV_SUCCESS) {
            sc_index = 1;
            vstate_local._4_4_ = local_d84;
            goto LAB_002cccc3;
          }
          if (bVar2) {
            bVar2 = isBlock((uint32_t)type_instr,vstate);
            if (!bVar2) {
              pIVar13 = ValidationState_t::FindDef(vstate,(uint32_t)type_instr);
              ValidationState_t::diag(&local_f60,vstate,SPV_ERROR_INVALID_DATA,pIVar13);
              ValidationState_t::VkErrorID_abi_cxx11_(&local_f80,vstate,0x1337,(char *)0x0);
              pDVar14 = DiagnosticStream::operator<<(&local_f60,&local_f80);
              pDVar14 = DiagnosticStream::operator<<
                                  (pDVar14,(char (*) [196])
                                           "Interface struct has no Block decoration but has BuiltIn members. Location decorations must be used on each member of OpVariable with a structure type that is a block not decorated with Location."
                                  );
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
              std::__cxx11::string::~string((string *)&local_f80);
              DiagnosticStream::~DiagnosticStream(&local_f60);
              sc_index = 1;
              goto LAB_002cccc3;
            }
            if (local_338 == Input) {
              num_workgroup_variables = num_workgroup_variables + 1;
            }
            if (local_338 == Output) {
              num_workgroup_variables_with_block = num_workgroup_variables_with_block + 1;
            }
            if ((1 < num_workgroup_variables) || (1 < num_workgroup_variables_with_block)) break;
          }
        }
        if ((local_338 == Workgroup) &&
           (num_workgroup_variables_with_aliased = num_workgroup_variables_with_aliased + 1,
           pIVar13 != (Instruction *)0x0)) {
          OVar4 = Instruction::opcode(pIVar13);
          if (OVar4 == OpTypeStruct) {
            bVar2 = hasDecoration((uint32_t)type_instr,Block,vstate);
            if (bVar2) {
              local_50 = local_50 + 1;
            }
            else if (((storage_class._3_1_ & 1) != UniformConstant >> 0x18) &&
                    (bVar2 = ValidationState_t::HasCapability(vstate,CapabilityShader), bVar2)) {
              ValidationState_t::diag(&local_1158,vstate,SPV_ERROR_INVALID_ID,local_148);
              pDVar14 = DiagnosticStream::operator<<
                                  (&local_1158,
                                   (char (*) [63])
                                   "Untyped workgroup variables in shaders must be block decorated")
              ;
              vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
              DiagnosticStream::~DiagnosticStream(&local_1158);
              sc_index = 1;
              goto LAB_002cccc3;
            }
            uVar5 = Instruction::id(local_148);
            bVar2 = hasDecoration(uVar5,Aliased,vstate);
            if (bVar2) {
              __range3._4_4_ = __range3._4_4_ + 1;
            }
          }
          else if (((storage_class._3_1_ & 1) != UniformConstant >> 0x18) &&
                  (bVar2 = ValidationState_t::HasCapability(vstate,CapabilityShader), bVar2)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&models,vstate,SPV_ERROR_INVALID_ID,local_148);
            pDVar14 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&models,
                                 (char (*) [71])
                                 "Untyped workgroup variables in shaders must be block decorated structs"
                                );
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&models);
            sc_index = 1;
            goto LAB_002cccc3;
          }
        }
        psVar10 = ValidationState_t::context(vstate);
        bVar2 = spvIsVulkanEnv(psVar10->target_env);
        if (bVar2) {
          psStack_1338 = ValidationState_t::GetExecutionModels(vstate,descs._4_4_);
          local_134c = ExecutionModelFragment;
          local_1348._M_node =
               (_Base_ptr)
               std::
               set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
               ::find(psStack_1338,&local_134c);
          iStack_1358 = std::
                        set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                        ::end(psStack_1338);
          local_1339 = std::operator!=(&local_1348,&stack0xffffffffffffeca8);
          local_136c = ExecutionModelVertex;
          local_1368._M_node =
               (_Base_ptr)
               std::
               set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
               ::find(psStack_1338,&local_136c);
          __range6 = (set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                      *)std::
                        set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                        ::end(psStack_1338);
          local_1359 = std::operator!=(&local_1368,(_Self *)&__range6);
          uVar5 = Instruction::id(local_148);
          psVar15 = ValidationState_t::id_decorations(vstate,uVar5);
          __end6 = std::
                   set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                   ::begin(psVar15);
          decoration = (Decoration *)
                       std::
                       set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                       ::end(psVar15);
          while (bVar2 = std::operator!=(&__end6,(_Self *)&decoration), bVar2) {
            pDVar11 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end6);
            local_1398 = pDVar11;
            memset(&local_13d8,0,0x18);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_13d8);
            Decoration::Decoration(&local_13c0,DecorationFlat,&local_13d8,0xffffffff);
            bVar2 = Decoration::operator==(pDVar11,&local_13c0);
            pDVar11 = local_1398;
            local_1419 = 0;
            local_141a = 0;
            local_1461 = 0;
            local_1462 = 0;
            local_14a9 = 0;
            local_14aa = 0;
            local_24b9 = true;
            if (!bVar2) {
              memset(&local_1418,0,0x18);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1418);
              local_1419 = 1;
              Decoration::Decoration(&local_1400,DecorationNoPerspective,&local_1418,0xffffffff);
              local_141a = 1;
              bVar2 = Decoration::operator==(pDVar11,&local_1400);
              pDVar11 = local_1398;
              local_24b9 = true;
              if (!bVar2) {
                memset(&local_1460,0,0x18);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1460);
                local_1461 = 1;
                Decoration::Decoration(&local_1448,DecorationSample,&local_1460,0xffffffff);
                local_1462 = 1;
                bVar2 = Decoration::operator==(pDVar11,&local_1448);
                pDVar11 = local_1398;
                local_24b9 = true;
                if (!bVar2) {
                  memset(&local_14a8,0,0x18);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_14a8);
                  local_14a9 = 1;
                  Decoration::Decoration(&local_1490,Centroid,&local_14a8,0xffffffff);
                  local_14aa = 1;
                  local_24b9 = Decoration::operator==(pDVar11,&local_1490);
                }
              }
            }
            if ((local_14aa & 1) != 0) {
              Decoration::~Decoration(&local_1490);
            }
            if ((local_14a9 & 1) != 0) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_14a8);
            }
            if ((local_1462 & 1) != 0) {
              Decoration::~Decoration(&local_1448);
            }
            if ((local_1461 & 1) != 0) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1460);
            }
            if ((local_141a & 1) != 0) {
              Decoration::~Decoration(&local_1400);
            }
            if ((local_1419 & 1) != 0) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1418);
            }
            Decoration::~Decoration(&local_13c0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_13d8);
            if (local_24b9 != false) {
              if ((local_338 == Input) &&
                 ((sVar12 = std::
                            set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                            ::size(psStack_1338), 1 < sVar12 || ((local_1359 & 1) != 0)))) {
                ValidationState_t::diag(&local_1688,vstate,SPV_ERROR_INVALID_ID,local_148);
                ValidationState_t::VkErrorID_abi_cxx11_(&local_16a8,vstate,0x183a,(char *)0x0);
                pDVar14 = DiagnosticStream::operator<<(&local_1688,&local_16a8);
                DVar6 = Decoration::dec_type(local_1398);
                ValidationState_t::SpvDecorationString_abi_cxx11_(&local_16c8,vstate,DVar6);
                pDVar14 = DiagnosticStream::operator<<(pDVar14,&local_16c8);
                pDVar14 = DiagnosticStream::operator<<
                                    (pDVar14,(char (*) [109])
                                             " decorated variable must not be used in vertex execution model as an Input storage class for Entry Point id "
                                    );
                pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
                pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [2])0x3cdc5b);
                vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
                std::__cxx11::string::~string((string *)&local_16c8);
                std::__cxx11::string::~string((string *)&local_16a8);
                DiagnosticStream::~DiagnosticStream(&local_1688);
                sc_index = 1;
                goto LAB_002cccc3;
              }
              if ((local_338 == Output) &&
                 ((sVar12 = std::
                            set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                            ::size(psStack_1338), 1 < sVar12 || ((local_1339 & 1) != 0)))) {
                ValidationState_t::diag(&local_18a0,vstate,SPV_ERROR_INVALID_ID,local_148);
                ValidationState_t::VkErrorID_abi_cxx11_(&local_18c0,vstate,0x1839,(char *)0x0);
                pDVar14 = DiagnosticStream::operator<<(&local_18a0,&local_18c0);
                DVar6 = Decoration::dec_type(local_1398);
                ValidationState_t::SpvDecorationString_abi_cxx11_((string *)local_18e0,vstate,DVar6)
                ;
                pDVar14 = DiagnosticStream::operator<<
                                    (pDVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_18e0);
                pDVar14 = DiagnosticStream::operator<<
                                    (pDVar14,(char (*) [112])
                                             " decorated variable must not be used in fragment execution model as an Output storage class for Entry Point id "
                                    );
                pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
                pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [2])0x3cdc5b);
                vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
                std::__cxx11::string::~string((string *)local_18e0);
                std::__cxx11::string::~string((string *)&local_18c0);
                DiagnosticStream::~DiagnosticStream(&local_18a0);
                sc_index = 1;
                goto LAB_002cccc3;
              }
            }
            std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end6);
          }
          uVar5 = Instruction::id(local_148);
          local_18e1 = hasDecoration(uVar5,DecorationFlat,vstate);
          if (((((local_1339 & 1) != 0) && (local_338 == Input)) && (!(bool)local_18e1)) &&
             (((bVar2 = ValidationState_t::IsFloatScalarType(vstate,(uint32_t)type_instr), bVar2 &&
               (uVar5 = ValidationState_t::GetBitWidth(vstate,(uint32_t)type_instr), uVar5 == 0x40))
              || (bVar2 = ValidationState_t::IsIntScalarOrVectorType(vstate,(uint32_t)type_instr),
                 bVar2)))) {
            ValidationState_t::diag(&local_1ac0,vstate,SPV_ERROR_INVALID_ID,local_148);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_1ae0,vstate,0x1288,(char *)0x0);
            pDVar14 = DiagnosticStream::operator<<(&local_1ac0,&local_1ae0);
            pDVar14 = DiagnosticStream::operator<<
                                (pDVar14,(char (*) [31])"Fragment OpEntryPoint operand ");
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&var_instr + 4));
            pDVar14 = DiagnosticStream::operator<<
                                (pDVar14,(char (*) [98])
                                         " with Input interfaces with integer or float type must have a Flat decoration for Entry Point id "
                                );
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(char (*) [2])0x3cdc5b);
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            std::__cxx11::string::~string((string *)&local_1ae0);
            DiagnosticStream::~DiagnosticStream(&local_1ac0);
            sc_index = 1;
            goto LAB_002cccc3;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      if ((num_workgroup_variables < 2) && (num_workgroup_variables_with_block < 2)) {
        psVar15 = ValidationState_t::id_decorations(vstate,descs._4_4_);
        __end4_1 = std::
                   set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                   ::begin(psVar15);
        decoration_1 = (Decoration *)
                       std::
                       set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                       ::end(psVar15);
        while (bVar2 = std::operator!=(&__end4_1,(_Self *)&decoration_1), bVar2) {
          linkage_name.field_2._8_8_ =
               std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end4_1);
          DVar6 = Decoration::dec_type((Decoration *)linkage_name.field_2._8_8_);
          assert_found_terminating_null = (undefined1)DVar6;
          if (DVar6 == DecorationLinkageAttributes) {
            this_01 = (utils *)Decoration::params((Decoration *)linkage_name.field_2._8_8_);
            utils::MakeString<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((string *)local_1cf8,this_01,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,
                       (bool)assert_found_terminating_null);
            pIVar13 = ValidationState_t::FindDef(vstate,descs._4_4_);
            ValidationState_t::diag
                      ((DiagnosticStream *)local_1ed0,vstate,SPV_ERROR_INVALID_BINARY,pIVar13);
            pDVar14 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)local_1ed0,
                                 (char (*) [49])"The LinkageAttributes Decoration (Linkage name: ");
            pDVar14 = DiagnosticStream::operator<<
                                (pDVar14,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1cf8);
            pDVar14 = DiagnosticStream::operator<<
                                (pDVar14,(char (*) [36])") cannot be applied to function id ");
            pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
            pDVar14 = DiagnosticStream::operator<<
                                (pDVar14,(char (*) [56])
                                         " because it is targeted by an OpEntryPoint instruction.");
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1ed0);
            sc_index = 1;
            std::__cxx11::string::~string((string *)local_1cf8);
            goto LAB_002cccc3;
          }
          std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end4_1);
        }
        local_1ed1 = ValidationState_t::HasCapability
                               (vstate,CapabilityWorkgroupMemoryExplicitLayoutKHR);
        if ((((!(bool)local_1ed1) ||
             (bVar2 = ValidationState_t::HasCapability(vstate,CapabilityUntypedPointersKHR), bVar2))
            || (num_workgroup_variables_with_aliased < 1)) || (local_50 < 1)) {
          if (((local_1ed1 & 1) == 0) && (0 < local_50)) {
            pIVar13 = ValidationState_t::FindDef(vstate,descs._4_4_);
            ValidationState_t::diag(&local_2460,vstate,SPV_ERROR_INVALID_BINARY,pIVar13);
            pDVar14 = DiagnosticStream::operator<<
                                (&local_2460,
                                 (char (*) [130])
                                 "Workgroup Storage Class variables can\'t be decorated with Block unless declaring the WorkgroupMemoryExplicitLayoutKHR capability."
                                );
            vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
            DiagnosticStream::~DiagnosticStream(&local_2460);
            sc_index = 1;
          }
          else {
LAB_002cccb9:
            sc_index = 0;
          }
        }
        else if (num_workgroup_variables_with_aliased == local_50) {
          if ((local_50 < 2) || (local_50 == __range3._4_4_)) goto LAB_002cccb9;
          pIVar13 = ValidationState_t::FindDef(vstate,descs._4_4_);
          ValidationState_t::diag(&local_2288,vstate,SPV_ERROR_INVALID_BINARY,pIVar13);
          pDVar14 = DiagnosticStream::operator<<
                              (&local_2288,
                               (char (*) [289])
                               "When declaring WorkgroupMemoryExplicitLayoutKHR, if more than one Workgroup Storage Class variable in the entry point interface point to a type decorated with Block, all of them must be decorated with Aliased (unless the UntypedPointerWorkgroupKHR capability is declared). Entry point id "
                              );
          pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
          pDVar14 = DiagnosticStream::operator<<
                              (pDVar14,(char (*) [33])" does not meet this requirement.");
          vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
          DiagnosticStream::~DiagnosticStream(&local_2288);
          sc_index = 1;
        }
        else {
          pIVar13 = ValidationState_t::FindDef(vstate,descs._4_4_);
          ValidationState_t::diag(&local_20b0,vstate,SPV_ERROR_INVALID_BINARY,pIVar13);
          pDVar14 = DiagnosticStream::operator<<
                              (&local_20b0,
                               (char (*) [259])
                               "When declaring WorkgroupMemoryExplicitLayoutKHR, either all or none of the Workgroup Storage Class variables in the entry point interface must point to struct types decorated with Block (unless the UntypedPointersKHR capability is declared).  Entry point id "
                              );
          pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
          pDVar14 = DiagnosticStream::operator<<
                              (pDVar14,(char (*) [33])" does not meet this requirement.");
          vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
          DiagnosticStream::~DiagnosticStream(&local_20b0);
          sc_index = 1;
        }
      }
      else {
        pIVar13 = ValidationState_t::FindDef(vstate,descs._4_4_);
        ValidationState_t::diag
                  ((DiagnosticStream *)&__range4_1,vstate,SPV_ERROR_INVALID_BINARY,pIVar13);
        pDVar14 = DiagnosticStream::operator<<
                            ((DiagnosticStream *)&__range4_1,
                             (char (*) [170])
                             "There must be at most one object per Storage Class that can contain a structure type containing members decorated with BuiltIn, consumed per entry-point. Entry Point id "
                            );
        pDVar14 = DiagnosticStream::operator<<(pDVar14,(uint *)((long)&descs + 4));
        pDVar14 = DiagnosticStream::operator<<
                            (pDVar14,(char (*) [33])" does not meet this requirement.");
        vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar14);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&__range4_1);
        sc_index = 1;
      }
LAB_002cccc3:
      std::
      unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
      ::~unordered_set((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                        *)&__range4);
      std::
      unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
      ::~unordered_set((unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
                        *)&output_var_builtin._M_h._M_single_bucket);
      std::
      unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
      ::~unordered_set((unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
                        *)&input_var_builtin._M_h._M_single_bucket);
      if (sc_index != 0) {
        return vstate_local._4_4_;
      }
      __gnu_cxx::
      __normal_iterator<const_spvtools::val::ValidationState_t::EntryPointDescription_*,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t CheckDecorationsOfEntryPoints(ValidationState_t& vstate) {
  for (uint32_t entry_point : vstate.entry_points()) {
    const auto& descs = vstate.entry_point_descriptions(entry_point);
    int num_builtin_block_inputs = 0;
    int num_builtin_block_outputs = 0;
    int num_workgroup_variables = 0;
    int num_workgroup_variables_with_block = 0;
    int num_workgroup_variables_with_aliased = 0;
    for (const auto& desc : descs) {
      std::unordered_set<Instruction*> seen_vars;
      std::unordered_set<spv::BuiltIn> input_var_builtin;
      std::unordered_set<spv::BuiltIn> output_var_builtin;
      for (auto interface : desc.interfaces) {
        Instruction* var_instr = vstate.FindDef(interface);
        if (!var_instr ||
            (spv::Op::OpVariable != var_instr->opcode() &&
             spv::Op::OpUntypedVariableKHR != var_instr->opcode())) {
          return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                 << "Interfaces passed to OpEntryPoint must be variables. "
                    "Found Op"
                 << spvOpcodeString(var_instr->opcode()) << ".";
        }
        const bool untyped_pointers =
            var_instr->opcode() == spv::Op::OpUntypedVariableKHR;
        const auto sc_index = 2u;
        const spv::StorageClass storage_class =
            var_instr->GetOperandAs<spv::StorageClass>(sc_index);
        if (vstate.version() >= SPV_SPIRV_VERSION_WORD(1, 4)) {
          // Starting in 1.4, OpEntryPoint must list all global variables
          // it statically uses and those interfaces must be unique.
          if (storage_class == spv::StorageClass::Function) {
            return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                   << "OpEntryPoint interfaces should only list global "
                      "variables";
          }

          if (!seen_vars.insert(var_instr).second) {
            return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                   << "Non-unique OpEntryPoint interface "
                   << vstate.getIdName(interface) << " is disallowed";
          }
        } else {
          if (storage_class != spv::StorageClass::Input &&
              storage_class != spv::StorageClass::Output) {
            return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                   << "OpEntryPoint interfaces must be OpVariables with "
                      "Storage Class of Input(1) or Output(3). Found Storage "
                      "Class "
                   << uint32_t(storage_class) << " for Entry Point id "
                   << entry_point << ".";
          }
        }

        // It is guaranteed (by validator ID checks) that ptr_instr is
        // OpTypePointer. Word 3 of this instruction is the type being pointed
        // to. For untyped variables, the pointee type comes from the data type
        // operand.
        const uint32_t type_id =
            untyped_pointers ? var_instr->word(4)
                             : vstate.FindDef(var_instr->word(1))->word(3);
        Instruction* type_instr = vstate.FindDef(type_id);
        const bool is_struct =
            type_instr && spv::Op::OpTypeStruct == type_instr->opcode();

        // Search all Built-in (on the variable or the struct)
        bool has_built_in = false;
        for (auto& dec :
             vstate.id_decorations(is_struct ? type_id : interface)) {
          if (dec.dec_type() != spv::Decoration::BuiltIn) continue;
          has_built_in = true;

          if (!spvIsVulkanEnv(vstate.context()->target_env)) continue;

          const spv::BuiltIn builtin = dec.builtin();
          if (storage_class == spv::StorageClass::Input) {
            if (!input_var_builtin.insert(builtin).second) {
              return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                     << vstate.VkErrorID(9658)
                     << "OpEntryPoint contains duplicate input variables "
                        "with "
                     << vstate.grammar().lookupOperandName(
                            SPV_OPERAND_TYPE_BUILT_IN, (uint32_t)builtin)
                     << " builtin";
            }
          }
          if (storage_class == spv::StorageClass::Output) {
            if (!output_var_builtin.insert(builtin).second) {
              return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                     << vstate.VkErrorID(9659)
                     << "OpEntryPoint contains duplicate output variables "
                        "with "
                     << vstate.grammar().lookupOperandName(
                            SPV_OPERAND_TYPE_BUILT_IN, (uint32_t)builtin)
                     << " builtin";
            }
          }
        }

        if (has_built_in) {
          if (auto error = CheckBuiltInVariable(interface, vstate))
            return error;

          if (is_struct) {
            if (!isBlock(type_id, vstate)) {
              return vstate.diag(SPV_ERROR_INVALID_DATA,
                                 vstate.FindDef(type_id))
                     << vstate.VkErrorID(4919)
                     << "Interface struct has no Block decoration but has "
                        "BuiltIn members. "
                        "Location decorations must be used on each member of "
                        "OpVariable with a structure type that is a block not "
                        "decorated with Location.";
            }
            if (storage_class == spv::StorageClass::Input)
              ++num_builtin_block_inputs;
            if (storage_class == spv::StorageClass::Output)
              ++num_builtin_block_outputs;
            if (num_builtin_block_inputs > 1 || num_builtin_block_outputs > 1)
              break;
          }
        }

        if (storage_class == spv::StorageClass::Workgroup) {
          ++num_workgroup_variables;
          if (type_instr) {
            if (spv::Op::OpTypeStruct == type_instr->opcode()) {
              if (hasDecoration(type_id, spv::Decoration::Block, vstate)) {
                ++num_workgroup_variables_with_block;
              } else if (untyped_pointers &&
                         vstate.HasCapability(spv::Capability::Shader)) {
                return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                       << "Untyped workgroup variables in shaders must be "
                          "block decorated";
              }
              if (hasDecoration(var_instr->id(), spv::Decoration::Aliased,
                                vstate))
                ++num_workgroup_variables_with_aliased;
            } else if (untyped_pointers &&
                       vstate.HasCapability(spv::Capability::Shader)) {
              return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                     << "Untyped workgroup variables in shaders must be block "
                        "decorated structs";
            }
          }
        }

        if (spvIsVulkanEnv(vstate.context()->target_env)) {
          const auto* models = vstate.GetExecutionModels(entry_point);
          const bool has_frag =
              models->find(spv::ExecutionModel::Fragment) != models->end();
          const bool has_vert =
              models->find(spv::ExecutionModel::Vertex) != models->end();
          for (const auto& decoration :
               vstate.id_decorations(var_instr->id())) {
            if (decoration == spv::Decoration::Flat ||
                decoration == spv::Decoration::NoPerspective ||
                decoration == spv::Decoration::Sample ||
                decoration == spv::Decoration::Centroid) {
              // VUID 04670 already validates these decorations are input/output
              if (storage_class == spv::StorageClass::Input &&
                  (models->size() > 1 || has_vert)) {
                return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                       << vstate.VkErrorID(6202)
                       << vstate.SpvDecorationString(decoration.dec_type())
                       << " decorated variable must not be used in vertex "
                          "execution model as an Input storage class for Entry "
                          "Point id "
                       << entry_point << ".";
              } else if (storage_class == spv::StorageClass::Output &&
                         (models->size() > 1 || has_frag)) {
                return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                       << vstate.VkErrorID(6201)
                       << vstate.SpvDecorationString(decoration.dec_type())
                       << " decorated variable must not be used in fragment "
                          "execution model as an Output storage class for "
                          "Entry Point id "
                       << entry_point << ".";
              }
            }
          }

          const bool has_flat =
              hasDecoration(var_instr->id(), spv::Decoration::Flat, vstate);
          if (has_frag && storage_class == spv::StorageClass::Input &&
              !has_flat &&
              ((vstate.IsFloatScalarType(type_id) &&
                vstate.GetBitWidth(type_id) == 64) ||
               vstate.IsIntScalarOrVectorType(type_id))) {
            return vstate.diag(SPV_ERROR_INVALID_ID, var_instr)
                     << vstate.VkErrorID(4744)
                     << "Fragment OpEntryPoint operand "
                     << interface << " with Input interfaces with integer or "
                                     "float type must have a Flat decoration "
                                     "for Entry Point id "
                     << entry_point << ".";
          }
        }
      }
      if (num_builtin_block_inputs > 1 || num_builtin_block_outputs > 1) {
        return vstate.diag(SPV_ERROR_INVALID_BINARY,
                           vstate.FindDef(entry_point))
               << "There must be at most one object per Storage Class that can "
                  "contain a structure type containing members decorated with "
                  "BuiltIn, consumed per entry-point. Entry Point id "
               << entry_point << " does not meet this requirement.";
      }
      // The LinkageAttributes Decoration cannot be applied to functions
      // targeted by an OpEntryPoint instruction
      for (auto& decoration : vstate.id_decorations(entry_point)) {
        if (spv::Decoration::LinkageAttributes == decoration.dec_type()) {
          const std::string linkage_name =
              spvtools::utils::MakeString(decoration.params());
          return vstate.diag(SPV_ERROR_INVALID_BINARY,
                             vstate.FindDef(entry_point))
                 << "The LinkageAttributes Decoration (Linkage name: "
                 << linkage_name << ") cannot be applied to function id "
                 << entry_point
                 << " because it is targeted by an OpEntryPoint instruction.";
        }
      }

      const bool workgroup_blocks_allowed = vstate.HasCapability(
          spv::Capability::WorkgroupMemoryExplicitLayoutKHR);
      if (workgroup_blocks_allowed &&
          !vstate.HasCapability(spv::Capability::UntypedPointersKHR) &&
          num_workgroup_variables > 0 &&
          num_workgroup_variables_with_block > 0) {
        if (num_workgroup_variables != num_workgroup_variables_with_block) {
          return vstate.diag(SPV_ERROR_INVALID_BINARY,
                             vstate.FindDef(entry_point))
                 << "When declaring WorkgroupMemoryExplicitLayoutKHR, "
                    "either all or none of the Workgroup Storage Class "
                    "variables "
                    "in the entry point interface must point to struct types "
                    "decorated with Block (unless the "
                    "UntypedPointersKHR capability is declared).  "
                    "Entry point id "
                 << entry_point << " does not meet this requirement.";
        }
        if (num_workgroup_variables_with_block > 1 &&
            num_workgroup_variables_with_block !=
            num_workgroup_variables_with_aliased) {
          return vstate.diag(SPV_ERROR_INVALID_BINARY,
                             vstate.FindDef(entry_point))
                 << "When declaring WorkgroupMemoryExplicitLayoutKHR, "
                    "if more than one Workgroup Storage Class variable in "
                    "the entry point interface point to a type decorated "
                    "with Block, all of them must be decorated with Aliased "
                    "(unless the UntypedPointerWorkgroupKHR capability is "
                    "declared). Entry point id "
                 << entry_point << " does not meet this requirement.";
        }
      } else if (!workgroup_blocks_allowed &&
                 num_workgroup_variables_with_block > 0) {
        return vstate.diag(SPV_ERROR_INVALID_BINARY,
                           vstate.FindDef(entry_point))
               << "Workgroup Storage Class variables can't be decorated with "
                  "Block unless declaring the WorkgroupMemoryExplicitLayoutKHR "
                  "capability.";
      }
    }
  }
  return SPV_SUCCESS;
}